

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *environment_00;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t tuple;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t argument1;
  undefined1 auStack_c0 [7];
  _Bool isMacro;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_64_8_e166d2b6 gcFrame;
  sysbvm_astUnexpandedApplicationNode_t **unexpandedNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  environment_00 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x40);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_c0 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
  sVar2 = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*environment_00);
  tuple = sysbvm_astNode_getAnalyzedType(sVar2);
  sVar3 = sysbvm_tuple_getType(context,tuple);
  sVar3 = sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context,sVar3);
  if (sVar3 == 0) {
    _Var1 = sysbvm_astNode_isMacroExpression(context,sVar2);
    if (_Var1) {
      _Var1 = sysbvm_astNode_isLiteralNode(context,sVar2);
      if (!_Var1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:2177: assertion failure: sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression)"
                  );
      }
      gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_astLiteralNode_getValue(sVar2);
      sVar2 = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                        (context,arguments,(sysbvm_tuple_t *)&gcFrameRecord.roots,environment_00);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                     (context,sVar2,*environment_00);
    }
    else {
      sVar2 = sysbvm_astFunctionApplicationNode_create
                        (context,*(sysbvm_tuple_t *)(*arguments + 0x10),sVar2,
                         *(sysbvm_tuple_t *)(*arguments + 0x30));
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                     (context,sVar2,*environment_00);
    }
  }
  else {
    argument1 = sysbvm_context_shallowCopy(context,*arguments);
    *(sysbvm_tuple_t *)(argument1 + 0x28) = sVar2;
    context_local =
         (sysbvm_context_t *)sysbvm_function_apply3(context,sVar3,tuple,argument1,*environment_00);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_c0);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t macro;
        sysbvm_astUnexpandedApplicationNode_t *unexpandedNode;
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t applicationNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacroExpression = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.functionOrMacroExpression);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeUnexpandedApplicationNodeWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*unexpandedNode);
        gcFrame.unexpandedNode->functionOrMacroExpression = gcFrame.functionOrMacroExpression;

        gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)gcFrame.unexpandedNode, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    // Is this a macro?
    bool isMacro = sysbvm_astNode_isMacroExpression(context, gcFrame.functionOrMacroExpression);
    if(isMacro)
    {
        SYSBVM_ASSERT(sysbvm_astNode_isLiteralNode(context, gcFrame.functionOrMacroExpression));
        gcFrame.macro = sysbvm_astLiteralNode_getValue(gcFrame.functionOrMacroExpression);
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.macro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Convert into application node and then analyze it.
    gcFrame.applicationNode = sysbvm_astFunctionApplicationNode_create(context, (*unexpandedNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, (*unexpandedNode)->arguments);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.applicationNode, *environment);
}